

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions>::
Bind<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions,cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::ModeEnum,cmCMakePresetsGraph::ReadFileResult(*)(cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::ModeEnum&,Json::Value_const*)>
          (Object<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions> *this,
          string_view *name,offset_in_RepeatOptions_to_ModeEnum member,
          _func_ReadFileResult_ModeEnum_ptr_Value_ptr *func,bool required)

{
  Object<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions> *pOVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)func;
  local_28._8_8_ = member;
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_28,required);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }